

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

Image * __thiscall nv::FloatImage::createImage(FloatImage *this,uint base_component,uint num)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  AutoPtr<nv::Image> AVar4;
  int iVar5;
  Image *this_00;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar6;
  ulong uVar7;
  undefined4 in_register_00000014;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint idx;
  uint8 rgba [4];
  AutoPtr<nv::Image> img;
  uint local_5c;
  ulong local_58;
  AutoPtr<nv::Image> local_50;
  uint local_44;
  FloatImage *local_40;
  ulong local_38;
  
  local_58 = CONCAT44(in_register_00000014,num);
  if (4 < num) {
    iVar5 = nvAbort("num <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                    ,0x5b,"Image *nv::FloatImage::createImage(uint, uint) const");
    if (iVar5 == 1) {
      raise(5);
    }
  }
  if (this->m_componentNum < (int)local_58 + base_component) {
    iVar5 = nvAbort("base_component + num <= m_componentNum",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                    ,0x5c,"Image *nv::FloatImage::createImage(uint, uint) const");
    if (iVar5 == 1) {
      raise(5);
    }
  }
  this_00 = (Image *)operator_new(0x18);
  Image::Image(this_00);
  local_50.m_ptr = this_00;
  Image::allocate(this_00,(uint)this->m_width,(uint)this->m_height);
  uVar10 = (uint)this->m_height * (uint)this->m_width;
  local_40 = this;
  if (uVar10 != 0) {
    uVar11 = local_58 & 0xffffffff;
    uVar9 = base_component * this->m_width * (uint)this->m_height;
    idx = 0;
    do {
      local_5c = 0xff000000;
      if ((int)local_58 != 0) {
        pfVar1 = local_40->m_mem;
        uVar8 = 0;
        uVar7 = (ulong)uVar9;
        do {
          iVar5 = (int)(pfVar1[uVar7] * 255.0);
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          *(char *)((long)&local_5c + uVar8) = (char)iVar5;
          uVar8 = uVar8 + 1;
          uVar7 = (ulong)((int)uVar7 + uVar10);
        } while (uVar11 != uVar8);
      }
      uVar3 = local_5c;
      uVar2 = local_5c >> 8;
      local_44 = local_5c >> 0x10 & 0xff;
      local_38 = (ulong)uVar9;
      paVar6 = &Image::pixel(local_50.m_ptr,idx)->field_0;
      *paVar6 = (anon_union_4_2_12391d8d_for_Color32_0)
                (((uVar2 & 0xff) << 8 | (uVar3 & 0xff) << 0x10) + local_44 | uVar3 & 0xff000000);
      idx = idx + 1;
      uVar9 = (int)local_38 + 1;
    } while (idx != uVar10);
  }
  AVar4.m_ptr = local_50.m_ptr;
  local_50.m_ptr = (Image *)0x0;
  AutoPtr<nv::Image>::~AutoPtr(&local_50);
  return AVar4.m_ptr;
}

Assistant:

Image * FloatImage::createImage(uint base_component/*= 0*/, uint num/*= 4*/) const
{
	nvCheck(num <= 4);
	nvCheck(base_component + num <= m_componentNum);
	
	AutoPtr<Image> img(new Image());
	img->allocate(m_width, m_height);
	
	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++) {
		
		uint c;
		uint8 rgba[4]= {0, 0, 0, 0xff};

		for(c = 0; c < num; c++) {
			float f = m_mem[size * (base_component + c) + i];
			rgba[c] = nv::clamp(int(255.0f * f), 0, 255);
		}

		img->pixel(i) = Color32(rgba[0], rgba[1], rgba[2], rgba[3]);
	}
	
	return img.release();
}